

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O2

int run_test_poll_nested_epoll(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  char *pcVar4;
  uv_poll_t poll_handle;
  
  iVar1 = epoll_create(1);
  if (iVar1 == -1) {
    pcVar4 = "fd != -1";
    uVar3 = 0x295;
  }
  else {
    uVar3 = uv_default_loop();
    iVar2 = uv_poll_init(uVar3,&poll_handle,iVar1);
    if (iVar2 == 0) {
      iVar2 = uv_poll_start(&poll_handle,1,abort);
      if (iVar2 == 0) {
        uVar3 = uv_default_loop();
        iVar2 = uv_run(uVar3,2);
        if (iVar2 == 0) {
          pcVar4 = "0 != uv_run(uv_default_loop(), UV_RUN_NOWAIT)";
          uVar3 = 0x299;
        }
        else {
          uv_close(&poll_handle,0);
          uVar3 = uv_default_loop();
          iVar2 = uv_run(uVar3,0);
          if (iVar2 == 0) {
            iVar1 = close(iVar1);
            if (iVar1 == 0) {
              loop = (uv_loop_t *)uv_default_loop();
              close_loop(loop);
              uVar3 = uv_default_loop();
              iVar1 = uv_loop_close(uVar3);
              if (iVar1 == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar4 = "0 == uv_loop_close(uv_default_loop())";
              uVar3 = 0x29f;
            }
            else {
              pcVar4 = "0 == close(fd)";
              uVar3 = 0x29d;
            }
          }
          else {
            pcVar4 = "0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
            uVar3 = 0x29c;
          }
        }
      }
      else {
        pcVar4 = "0 == uv_poll_start(&poll_handle, UV_READABLE, (uv_poll_cb) abort)";
        uVar3 = 0x298;
      }
    }
    else {
      pcVar4 = "0 == uv_poll_init(uv_default_loop(), &poll_handle, fd)";
      uVar3 = 0x297;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll.c",
          uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(poll_nested_epoll) {
  uv_poll_t poll_handle;
  int fd;

  fd = epoll_create(1);
  ASSERT(fd != -1);

  ASSERT(0 == uv_poll_init(uv_default_loop(), &poll_handle, fd));
  ASSERT(0 == uv_poll_start(&poll_handle, UV_READABLE, (uv_poll_cb) abort));
  ASSERT(0 != uv_run(uv_default_loop(), UV_RUN_NOWAIT));

  uv_close((uv_handle_t*) &poll_handle, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == close(fd));

  MAKE_VALGRIND_HAPPY();
  return 0;
}